

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
::Read(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
       *this,TextReader<fmt::Locale> *bound_reader)

{
  NLHeader *pNVar1;
  TextReader<fmt::Locale> *pTVar2;
  byte *loc;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  char code;
  bool bVar9;
  bool bVar10;
  ArgList local_58;
  undefined1 local_48 [16];
  
  bVar9 = bound_reader == (TextReader<fmt::Locale> *)0x0;
  pNVar1 = this->header_;
  this->num_vars_and_exprs_ =
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  do {
    pTVar2 = this->reader_;
    loc = (byte *)(pTVar2->super_ReaderBase).ptr_;
    (pTVar2->super_ReaderBase).token_ = (char *)loc;
    (pTVar2->super_ReaderBase).ptr_ = (char *)(loc + 1);
    bVar8 = *loc;
    if (0x61 < bVar8) {
      if (bVar8 < 0x6b) {
        if (bVar8 == 0x62) {
          if (bVar9 == false) {
            if (bound_reader == (TextReader<fmt::Locale> *)0x0) {
              local_48 = (undefined1  [16])0x0;
              local_58.types_ = 0;
              local_58.field_1.values_ = (Value *)local_48;
              TextReader<fmt::Locale>::DoReportError
                        (pTVar2,(char *)loc,(CStringRef)0x2654cf,&local_58);
            }
            pTVar2 = this->reader_;
            pcVar3 = (bound_reader->super_ReaderBase).ptr_;
            pcVar4 = (bound_reader->super_ReaderBase).start_;
            pcVar5 = (bound_reader->super_ReaderBase).token_;
            (pTVar2->super_ReaderBase).end_ = (bound_reader->super_ReaderBase).end_;
            (pTVar2->super_ReaderBase).token_ = pcVar5;
            (pTVar2->super_ReaderBase).ptr_ = pcVar3;
            (pTVar2->super_ReaderBase).start_ = pcVar4;
            std::__cxx11::string::_M_assign((string *)&(pTVar2->super_ReaderBase).name_);
            pTVar2->line_ = bound_reader->line_;
            pTVar2->line_start_ = bound_reader->line_start_;
            bVar10 = true;
            bound_reader = (TextReader<fmt::Locale> *)0x0;
          }
          else {
            NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
            ::
            ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::VarHandler>
                      ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                        *)this);
            bVar8 = (byte)this->flags_ & 1;
            bVar10 = bVar8 == 0;
            bVar9 = (bool)(bVar9 & -bVar8);
          }
          goto LAB_001bf911;
        }
        if (bVar8 != 100) goto switchD_001bf5ba_caseD_44;
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
        ::
        ReadInitialValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::AlgebraicConHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                    *)this);
      }
      else if (bVar8 == 0x6b) {
        ReadColumnSizes<true>(this);
      }
      else if (bVar8 == 0x72) {
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
        ::
        ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::AlgebraicConHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                    *)this);
      }
      else {
        if (bVar8 != 0x78) goto switchD_001bf5ba_caseD_44;
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
        ::
        ReadInitialValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::VarHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                    *)this);
      }
      goto LAB_001bf90f;
    }
    switch(bVar8) {
    case 0x43:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons);
      goto LAB_001bf71f;
    case 0x44:
    case 0x45:
    case 0x48:
    case 0x49:
    case 0x4d:
    case 0x4e:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x54:
    case 0x55:
switchD_001bf5ba_caseD_44:
      local_48 = (undefined1  [16])0x0;
      local_58.types_ = 0;
      local_58.field_1.values_ = (Value *)local_48;
      TextReader<fmt::Locale>::DoReportError(pTVar2,(char *)loc,(CStringRef)0x2693ca,&local_58);
      break;
    case 0x46:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
      uVar6 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      if (1 < uVar6) {
        local_48 = (undefined1  [16])0x0;
        local_58.types_ = 0;
        local_58.field_1.values_ = (Value *)local_48;
        TextReader<fmt::Locale>::DoReportError
                  (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x268903,
                   &local_58);
      }
      TextReader<fmt::Locale>::ReadInt<int>(this->reader_);
      TextReader<fmt::Locale>::ReadName(this->reader_);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      break;
    case 0x47:
      NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::ObjHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                  *)this);
      break;
    case 0x4a:
      NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::AlgebraicConHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                  *)this);
      break;
    case 0x4b:
      ReadColumnSizes<false>(this);
      break;
    case 0x4c:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      ReadLogicalExpr(this);
      break;
    case 0x4f:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_objs);
      TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
LAB_001bf71f:
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      pTVar2 = this->reader_;
      pcVar3 = (pTVar2->super_ReaderBase).ptr_;
      (pTVar2->super_ReaderBase).token_ = pcVar3;
      (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
      code = *pcVar3;
      bVar10 = true;
LAB_001bf802:
      ReadNumericExpr(this,code,bVar10);
      break;
    case 0x53:
      uVar6 = TextReader<fmt::Locale>::ReadUInt<int>(pTVar2);
      if (7 < (int)uVar6) {
        local_48 = (undefined1  [16])0x0;
        local_58.types_ = 0;
        local_58.field_1.values_ = (Value *)local_48;
        TextReader<fmt::Locale>::DoReportError
                  (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x26903e,
                   &local_58);
      }
      switch(uVar6 & 3) {
      case 0:
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::VarHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                    *)this,uVar6);
        break;
      case 1:
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::ConHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                    *)this,uVar6);
        break;
      case 2:
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::ObjHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                    *)this,uVar6);
        break;
      case 3:
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::ProblemHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                    *)this,uVar6);
      }
      break;
    case 0x56:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars,
               this->num_vars_and_exprs_);
      iVar7 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      if (iVar7 != 0) {
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
        ::
        ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<BasicTestExpr<0>>,BasicTestExpr<0>>::LinearExprHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                    *)this,iVar7);
      }
      pTVar2 = this->reader_;
      pcVar3 = (pTVar2->super_ReaderBase).ptr_;
      (pTVar2->super_ReaderBase).token_ = pcVar3;
      (pTVar2->super_ReaderBase).ptr_ = pcVar3 + 1;
      code = *pcVar3;
      bVar10 = false;
      goto LAB_001bf802;
    default:
      if ((bVar8 != 0) || ((byte *)(pTVar2->super_ReaderBase).end_ != loc))
      goto switchD_001bf5ba_caseD_44;
      if (bVar9 != false) {
        local_48 = (undefined1  [16])0x0;
        local_58.types_ = 0;
        local_58.field_1.values_ = (Value *)local_48;
        TextReader<fmt::Locale>::DoReportError(pTVar2,(char *)loc,(CStringRef)0x2653a3,&local_58);
      }
      bVar10 = false;
      goto LAB_001bf911;
    }
LAB_001bf90f:
    bVar10 = true;
LAB_001bf911:
    if (!bVar10) {
      return;
    }
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}